

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_stage
               (StateRecorder *recorder,Hasher *h,VkPipelineShaderStageCreateInfo *stage)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar4;
  ulong uVar5;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  ulong uVar6;
  Hash hash;
  byte *local_28;
  
  local_28 = (byte *)stage->pName;
  if (local_28 == (byte *)0x0) {
    return false;
  }
  uVar5 = (h->h * 0x100000001b3 ^ (ulong)stage->flags) * 0x100000001b3 ^ 0xff;
  h->h = uVar5;
  bVar1 = *local_28;
  pbVar3 = local_28;
  while (bVar1 != 0) {
    pbVar3 = pbVar3 + 1;
    uVar5 = uVar5 * 0x100000001b3 ^ (ulong)bVar1;
    h->h = uVar5;
    bVar1 = *pbVar3;
  }
  h->h = h->h * 0x100000001b3 ^ (ulong)stage->stage;
  if (stage->module == (VkShaderModule)0x0) {
    info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)stage->pNext;
    for (pVVar4 = info; pVVar4 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
        pVVar4 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)pVVar4->pNext) {
      if (pVVar4->sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) goto LAB_0011b6b4;
    }
    pVVar4 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0011b6b4:
    if (pVVar4 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
      if (pVVar4->pIdentifier < (uint8_t *)0x4) {
        uVar5 = 0xaf63bd4c8601b7df;
      }
      else {
        uVar5 = 0xcbf29ce484222325;
        uVar6 = 0;
        do {
          uVar5 = (ulong)*(uint *)(*(long *)(pVVar4 + 1) + uVar6 * 4) ^ uVar5 * 0x100000001b3;
          uVar6 = uVar6 + 1;
        } while ((ulong)pVVar4->pIdentifier >> 2 != uVar6);
        uVar5 = uVar5 * 0x100000001b3;
      }
      local_28 = (byte *)(pVVar4->identifierSize ^ uVar5);
      goto LAB_0011b72d;
    }
    for (; info != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
        info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info->pNext) {
      if (info->sType == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
      goto LAB_0011b787;
    }
    info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0011b787:
    if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
      return false;
    }
    bVar2 = StateRecorder::Impl::get_hash_for_shader_module(recorder->impl,info,(Hash *)&local_28);
  }
  else {
    bVar2 = StateRecorder::get_hash_for_shader_module(recorder,stage->module,(Hash *)&local_28);
  }
  if (bVar2 == false) {
    return false;
  }
LAB_0011b72d:
  uVar5 = ((ulong)local_28 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^
          (ulong)local_28 >> 0x20;
  h->h = uVar5;
  if (stage->pSpecializationInfo == (VkSpecializationInfo *)0x0) {
    h->h = uVar5 * 0x100000001b3;
  }
  else {
    hash_specialization_info(h,stage->pSpecializationInfo);
  }
  bVar2 = hash_pnext_chain(recorder,h,stage->pNext,(DynamicStateInfo *)0x0,0);
  return bVar2;
}

Assistant:

static bool compute_hash_stage(const StateRecorder &recorder, Hasher &h, const VkPipelineShaderStageCreateInfo &stage)
{
	if (!stage.pName)
		return false;

	h.u32(stage.flags);
	h.string(stage.pName);
	h.u32(stage.stage);

	Hash hash;
	if (stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	if (stage.pSpecializationInfo)
		hash_specialization_info(h, *stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, stage.pNext, nullptr, 0))
		return false;

	return true;
}